

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_set_test.cc
# Opt level: O1

void __thiscall
phmap::priv::anon_unknown_5::ParallelFlatHashSet_BitfieldArgument_Test::TestBody
          (ParallelFlatHashSet_BitfieldArgument_Test *this)

{
  SharedLock m;
  anon_class_1_0_00000001 always_erase;
  parallel_flat_hash_set<int,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>,_4UL,_phmap::NullMutex>
  s;
  key_equal local_381;
  int local_380;
  allocator_type local_379;
  pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>::iterator,_phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>::iterator>
  local_378;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  local_318;
  
  local_378.first.inner_._0_4_ = 0;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<int>>
  ::parallel_hash_set<int_const*>
            ((parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<int>>
              *)&local_318,(int *)&local_378,(int *)((long)&local_378.first.inner_ + 4),0,
             (hasher *)&local_380,&local_381,&local_379);
  local_380 = 0;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<int>>
  ::emplace_decomposable_with_hash<int,int_const&>
            ((pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>::iterator,_bool>
              *)&local_378,
             (parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<int>>
              *)&local_318,&local_380,0,&local_380);
  local_380 = 0;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<int>>
  ::emplace_decomposable_with_hash<int,int_const&>
            ((pair<phmap::priv::parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>::iterator,_bool>
              *)&local_378,
             (parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<int>>
              *)&local_318,&local_380,0,&local_380);
  local_378.first.inner_._0_4_ = 0;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<int>>
  ::insert<int_const*>
            ((parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<int>>
              *)&local_318,(int *)&local_378,(int *)((long)&local_378.first.inner_ + 4));
  local_378.first.inner_._0_4_ = 0;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<int>>
  ::
  erase_if_impl<int,phmap::priv::parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<int>>::erase<int>(int_const&)::_lambda(int_const&)_1_,phmap::LockableBaseImpl<phmap::NullMutex>::DoNothing>
            ((parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<int>>
              *)&local_318,(key_arg<int> *)&local_378,(anon_class_1_0_00000001 *)&local_380);
  local_380 = 0;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<int>>
  ::find<int,phmap::LockableBaseImpl<phmap::NullMutex>::DoNothing>
            (&local_378.first,
             (parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<int>>
              *)&local_318,&local_380,0,(DoNothing *)&local_381);
  raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  ::prefetch_hash((raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
                   *)&local_318,0);
  local_380 = 0;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<int>>
  ::find<int,phmap::LockableBaseImpl<phmap::NullMutex>::DoNothing>
            (&local_378.first,
             (parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<int>>
              *)&local_318,&local_380,0,(DoNothing *)&local_381);
  local_380 = 0;
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<int>>
  ::find<int,phmap::LockableBaseImpl<phmap::NullMutex>::DoNothing>
            (&local_378.first,
             (parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<int>,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<int>>
              *)&local_318,&local_380,0,(DoNothing *)&local_381);
  local_380 = 0;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  ::equal_range<int>(&local_378,&local_318,&local_380);
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<int>_>
  ::~parallel_hash_set(&local_318);
  return;
}

Assistant:

TEST(THIS_TEST_NAME, BitfieldArgument) {
  union {
    int n : 1;
  };
  n = 0;
  phmap::THIS_HASH_SET<int> s = {n};
  s.insert(n);
  s.insert(s.end(), n);
  s.insert({n});
  s.erase(n);
  s.count(n);
  s.prefetch(n);
  s.find(n);
  s.contains(n);
  s.equal_range(n);
}